

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

void * IM483IThread(void *pParam)

{
  double angle;
  int iVar1;
  int iVar2;
  CRITICAL_SECTION *__mutex;
  long lVar3;
  
  __mutex = IM483ICS;
  lVar3 = 0;
  do {
    if (*(void **)((long)addrsIM483I + lVar3 * 2) == pParam) {
      mSleep((long)*(int *)((long)pParam + 0x52c));
      iVar2 = 0;
      do {
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        angle = *(double *)((long)angleIM483I + lVar3 * 2);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        iVar1 = SetMaxAngleIM483I((IM483I *)pParam,angle);
        if (iVar1 != 0) {
          iVar2 = iVar1;
        }
        mSleep((long)*(int *)((long)pParam + 0x52c));
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        *(int *)((long)resIM483I + lVar3) = iVar2;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      } while (*(int *)((long)bExitIM483I + lVar3) == 0);
      return (void *)0x0;
    }
    __mutex = __mutex + 1;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x40);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE IM483IThread(void* pParam)
{
	IM483I* pIM483I = (IM483I*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	double angle = 0;

	while (addrsIM483I[id] != pIM483I)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	mSleep(pIM483I->threadperiod);

	for (;;)
	{
		EnterCriticalSection(&IM483ICS[id]);
		angle = angleIM483I[id];
		LeaveCriticalSection(&IM483ICS[id]);
		res = SetMaxAngleIM483I(pIM483I, angle);
		if (res != EXIT_SUCCESS) err = res;
		mSleep(pIM483I->threadperiod);
		EnterCriticalSection(&IM483ICS[id]);
		resIM483I[id] = err;
		LeaveCriticalSection(&IM483ICS[id]);
		if (bExitIM483I[id]) break;
	}

	return 0;
}